

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::SampledFunc::checkArguments
          (SampledFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  not_null<const_slang::ast::Type_*> *pnVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,1,1);
  if (bVar2) {
    AssertionExpr::checkSampledValueExpr
              (*args->_M_ptr,context,false,(DiagCode)0x22000b,(DiagCode)0x23000b);
    pnVar3 = &(*args->_M_ptr)->type;
  }
  else {
    pnVar3 = (not_null<const_slang::ast::Type_*> *)&pCVar1->errorType;
  }
  return pnVar3->ptr;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        AssertionExpr::checkSampledValueExpr(*args[0], context, false, diag::SampledValueLocalVar,
                                             diag::SampledValueMatched);

        return *args[0]->type;
    }